

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::send_spi(Spi *this,uint8_t *data,int n)

{
  int iVar1;
  DWORD dwNumBytesSent;
  
  if (n < 1) {
    return;
  }
  send_byte(this,'\x11');
  send_byte(this,(uint8_t)(n + -1));
  send_byte(this,(uint8_t)((uint)(n + -1) >> 8));
  iVar1 = FT_Write(this->ftHandle,data,n);
  if (iVar1 == 0) {
    if (n == 0) {
      return;
    }
    fprintf(_stderr,"Write error (chunk, rc=%u, expected %d).\n",0,(ulong)(uint)n);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Write error!",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  error(this,2);
}

Assistant:

void Spi::send_spi(uint8_t *data, int n) {
	if (n < 1)
		return;

	/* Output only, update data on negative clock edge. */
	send_byte(MC_DATA_OUT | MC_DATA_OCN);
	send_byte(n - 1);
	send_byte((n - 1) >> 8);

	FT_STATUS ftStatus;
	DWORD dwNumBytesSent = 0;

	ftStatus = FT_Write(ftHandle, data, n, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}

	if (dwNumBytesSent != (unsigned int) n) {
		fprintf(stderr, "Write error (chunk, rc=%u, expected %d).\n",
				dwNumBytesSent, n);
		error(2);
	}
}